

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O2

void VP8LColorSpaceTransform
               (int width,int height,int bits,int quality,uint32_t *argb,uint32_t *image)

{
  int *piVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint red_to_blue;
  int iVar10;
  uint uVar11;
  undefined4 in_register_00000034;
  VP8LMultipliers prev_x;
  VP8LMultipliers prev_y;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint32_t *puVar15;
  float fVar16;
  float fVar17;
  float local_92c;
  VP8LMultipliers local_908;
  int local_904;
  uint local_900;
  uint local_8fc;
  uint local_8f8;
  int local_8f4;
  ulong local_8f0;
  uint32_t *local_8e8;
  int local_8e0;
  int local_8dc;
  int local_8d8;
  int local_8d4;
  long local_8d0;
  uint32_t *local_8c8;
  uint32_t *local_8c0;
  uint32_t *local_8b8;
  long local_8b0;
  undefined8 local_8a8;
  ulong local_8a0;
  uint32_t *local_898;
  long local_890;
  long local_888;
  ulong local_880;
  ulong local_878;
  long local_870;
  ulong local_868;
  ulong local_860;
  long local_858;
  long local_850;
  long local_848;
  long local_840;
  int accumulated_blue_histo [256];
  int accumulated_red_histo [256];
  
  local_8a8 = CONCAT44(in_register_00000034,height);
  bVar4 = (byte)bits;
  uVar7 = 1 << (bVar4 & 0x1f);
  local_8f0 = (ulong)uVar7;
  uVar9 = (uVar7 + width) - 1 >> (bVar4 & 0x1f);
  uVar7 = (uVar7 + height) - 1;
  local_904 = bits;
  local_8c8 = image;
  memset(accumulated_red_histo,0,0x400);
  memset(accumulated_blue_histo,0,0x400);
  local_880 = 0;
  iVar5 = quality * 7 >> 8;
  local_8d4 = -4;
  if (-4 < iVar5) {
    local_8d4 = iVar5;
  }
  local_8d4 = local_8d4 + 4;
  local_858 = 1;
  if (0x18 < quality) {
    local_858 = (ulong)(0x32 < (uint)quality) * 3 + 4;
  }
  local_8d0 = (long)(int)uVar9;
  local_878 = 0;
  if (0 < (int)uVar9) {
    local_878 = (ulong)uVar9;
  }
  local_8a0 = (ulong)(uVar7 >> (bVar4 & 0x1f));
  if ((int)(uVar7 >> (bVar4 & 0x1f)) < 1) {
    local_8a0 = local_880;
  }
  local_8b0 = (long)(width + 2);
  local_850 = (long)width * 4;
  local_8b8 = argb + -(long)width;
  uVar7 = 0 >> (bVar4 & 0x1f);
  uVar13 = 0;
  uVar9 = 0;
  local_900 = 0;
  local_8fc = 0;
  local_8f8 = 0;
  local_8d8 = quality;
  local_8c0 = argb;
  do {
    if (local_880 == local_8a0) {
      return;
    }
    iVar6 = (int)local_880 << ((byte)local_904 & 0x1f);
    iVar5 = (int)local_8f0;
    iVar14 = (int)local_8a8;
    iVar10 = iVar6 + iVar5;
    if (iVar14 <= iVar6 + iVar5) {
      iVar10 = iVar14;
    }
    local_888 = local_880 * local_8d0;
    local_840 = (long)iVar10;
    iVar10 = iVar10 - iVar6;
    local_890 = (long)iVar6;
    local_8e0 = iVar6 * width;
    local_898 = argb + local_8e0;
    local_8dc = iVar14 - iVar6;
    if (iVar5 < iVar14 - iVar6) {
      local_8dc = iVar5;
    }
    for (local_860 = 0; local_860 != local_878; local_860 = local_860 + 1) {
      uVar11 = (int)local_860 << ((byte)local_904 & 0x1f);
      local_868 = (ulong)uVar11;
      local_8f4 = uVar11 + (int)local_8f0;
      if (width <= local_8f4) {
        local_8f4 = width;
      }
      local_870 = local_860 + local_888;
      if (local_880 != 0) {
        local_8f8 = local_8c8[local_870 - local_8d0];
        local_8fc = local_8f8 >> 8;
        local_900 = local_8f8 >> 0x10;
      }
      prev_x = (VP8LMultipliers)
               ((uint3)uVar9 & 0xff | (uint3)((uVar13 & 0xff | (uVar7 & 0xff) << 8) << 8));
      prev_y = (VP8LMultipliers)
               ((uint3)local_8f8 & 0xff |
               (uint3)((local_8fc & 0xff) << 8) | (uint3)((local_900 & 0xff) << 0x10));
      iVar6 = local_8f4 - uVar11;
      local_8e8 = local_898 + (int)uVar11;
      local_92c = GetPredictionCostCrossColorRed
                            (local_8e8,width,iVar6,iVar10,prev_x,prev_y,0,accumulated_red_histo);
      uVar9 = 0;
      for (iVar5 = 0; iVar5 != local_8d4; iVar5 = iVar5 + 1) {
        uVar7 = 0x20 >> ((byte)iVar5 & 0x1f);
        for (iVar14 = -uVar7; iVar14 <= (int)uVar7; iVar14 = iVar14 + uVar7 * 2) {
          fVar16 = GetPredictionCostCrossColorRed
                             (local_8e8,width,iVar6,iVar10,prev_x,prev_y,iVar14 + uVar9,
                              accumulated_red_histo);
          uVar13 = iVar14 + uVar9;
          if (local_92c <= fVar16) {
            fVar16 = local_92c;
            uVar13 = uVar9;
          }
          uVar9 = uVar13;
          local_92c = fVar16;
        }
      }
      fVar16 = GetPredictionCostCrossColorBlue
                         (local_8e8,width,iVar6,iVar10,prev_x,prev_y,0,0,accumulated_blue_histo);
      lVar8 = 0;
      uVar7 = 0;
      uVar13 = 0;
      do {
        if (lVar8 == local_858) goto LAB_00136fc0;
        bVar3 = 0x18 < local_8d8;
        cVar2 = (&DAT_001419c0)[lVar8];
        lVar12 = 0;
        local_848 = lVar8;
        do {
          if (lVar12 == 8) break;
          uVar11 = (int)(char)(&DAT_001419b0)[lVar12 * 2] * (int)cVar2 + uVar13;
          red_to_blue = (int)(char)(&DAT_001419b1)[lVar12 * 2] * (int)cVar2 + uVar7;
          fVar17 = GetPredictionCostCrossColorBlue
                             (local_8e8,width,iVar6,iVar10,prev_x,prev_y,uVar11,red_to_blue,
                              accumulated_blue_histo);
          if (fVar16 <= fVar17) {
            uVar11 = uVar13;
            fVar17 = fVar16;
            red_to_blue = uVar7;
          }
          uVar7 = red_to_blue;
          fVar16 = fVar17;
          uVar13 = uVar11;
          lVar12 = lVar12 + 1;
        } while (lVar8 != 4 || bVar3);
        lVar8 = local_848 + 1;
        argb = local_8c0;
      } while (((2 < local_848 - 4U) || (uVar13 != 0)) || (uVar7 != 0));
      uVar7 = 0;
      uVar13 = 0;
LAB_00136fc0:
      uVar11 = uVar9 & 0xff | (uVar13 & 0xff | uVar7 << 8) << 8;
      local_8c8[local_870] = uVar11 | 0xff000000;
      local_908.red_to_blue_ = (uint8_t)uVar7;
      local_908._0_2_ = SUB42(uVar11,0);
      iVar5 = width - (int)local_868;
      if ((int)local_8f0 < iVar5) {
        iVar5 = (int)local_8f0;
      }
      iVar14 = (int)local_868 + local_8e0;
      puVar15 = argb + iVar14;
      for (iVar6 = local_8dc; lVar8 = local_890, 0 < iVar6; iVar6 = iVar6 + -1) {
        (*VP8LTransformColor)(&local_908,puVar15,iVar5);
        puVar15 = (uint32_t *)((long)puVar15 + local_850);
      }
      for (; lVar8 < local_840; lVar8 = lVar8 + 1) {
        for (lVar12 = (long)iVar14; lVar12 < (int)lVar8 * width + local_8f4; lVar12 = lVar12 + 1) {
          uVar11 = local_8c0[lVar12];
          if ((((lVar12 < 2) || (uVar11 != local_8c0[lVar12 + -2])) ||
              (uVar11 != local_8c0[lVar12 + -1])) &&
             (((lVar12 < local_8b0 || (local_8c0[lVar12 + -2] != local_8b8[lVar12 + -2])) ||
              ((local_8c0[lVar12 + -1] != local_8b8[lVar12 + -1] || (uVar11 != local_8b8[lVar12]))))
             )) {
            piVar1 = (int *)((long)accumulated_red_histo + (ulong)(uVar11 >> 0xe & 0x3fc));
            *piVar1 = *piVar1 + 1;
            accumulated_blue_histo[uVar11 & 0xff] = accumulated_blue_histo[uVar11 & 0xff] + 1;
          }
        }
        iVar14 = iVar14 + width;
      }
      argb = local_8c0;
    }
    local_880 = local_880 + 1;
  } while( true );
}

Assistant:

void VP8LColorSpaceTransform(int width, int height, int bits, int quality,
                             uint32_t* const argb, uint32_t* image) {
  const int max_tile_size = 1 << bits;
  const int tile_xsize = VP8LSubSampleSize(width, bits);
  const int tile_ysize = VP8LSubSampleSize(height, bits);
  int accumulated_red_histo[256] = { 0 };
  int accumulated_blue_histo[256] = { 0 };
  int tile_x, tile_y;
  VP8LMultipliers prev_x, prev_y;
  MultipliersClear(&prev_y);
  MultipliersClear(&prev_x);
  for (tile_y = 0; tile_y < tile_ysize; ++tile_y) {
    for (tile_x = 0; tile_x < tile_xsize; ++tile_x) {
      int y;
      const int tile_x_offset = tile_x * max_tile_size;
      const int tile_y_offset = tile_y * max_tile_size;
      const int all_x_max = GetMin(tile_x_offset + max_tile_size, width);
      const int all_y_max = GetMin(tile_y_offset + max_tile_size, height);
      const int offset = tile_y * tile_xsize + tile_x;
      if (tile_y != 0) {
        ColorCodeToMultipliers(image[offset - tile_xsize], &prev_y);
      }
      prev_x = GetBestColorTransformForTile(tile_x, tile_y, bits,
                                            prev_x, prev_y,
                                            quality, width, height,
                                            accumulated_red_histo,
                                            accumulated_blue_histo,
                                            argb);
      image[offset] = MultipliersToColorCode(&prev_x);
      CopyTileWithColorTransform(width, height, tile_x_offset, tile_y_offset,
                                 max_tile_size, prev_x, argb);

      // Gather accumulated histogram data.
      for (y = tile_y_offset; y < all_y_max; ++y) {
        int ix = y * width + tile_x_offset;
        const int ix_end = ix + all_x_max - tile_x_offset;
        for (; ix < ix_end; ++ix) {
          const uint32_t pix = argb[ix];
          if (ix >= 2 &&
              pix == argb[ix - 2] &&
              pix == argb[ix - 1]) {
            continue;  // repeated pixels are handled by backward references
          }
          if (ix >= width + 2 &&
              argb[ix - 2] == argb[ix - width - 2] &&
              argb[ix - 1] == argb[ix - width - 1] &&
              pix == argb[ix - width]) {
            continue;  // repeated pixels are handled by backward references
          }
          ++accumulated_red_histo[(pix >> 16) & 0xff];
          ++accumulated_blue_histo[(pix >> 0) & 0xff];
        }
      }
    }
  }
}